

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * __thiscall fs::Path::setPath(Path *this,string *path)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_58._M_dataplus._M_p =
       (pointer)(this->_path).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (this->_path).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (this->_path).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  uVar1 = std::__cxx11::string::find_first_not_of
                    ((char *)path,(ulong)(this->_separator)._M_dataplus._M_p,0);
  if (uVar1 != 0xffffffffffffffff) {
    do {
      uVar1 = std::__cxx11::string::find_first_of
                        ((char *)path,(ulong)(this->_separator)._M_dataplus._M_p,uVar1);
      std::__cxx11::string::substr((ulong)&local_58,(ulong)path);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->_path,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      uVar1 = std::__cxx11::string::find_first_not_of
                        ((char *)path,(ulong)(this->_separator)._M_dataplus._M_p,uVar1);
    } while (uVar1 != 0xffffffffffffffff);
  }
  std::operator+(&local_58,path,&this->_separator);
  std::__cxx11::string::operator=((string *)&this->_fullpath,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1));
  }
  updateComplete(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setPath(std::string const& path)
{
  std::vector<std::string>().swap(_path);
  std::string::size_type b = 0;

  while ((b = path.find_first_not_of(_separator, b)) != std::string::npos) {
	  auto e = path.find_first_of(_separator, b);
	  _path.push_back(path.substr(b, e - b));
	  b = e;
  }
  _fullpath = path + _separator;
  updateComplete();
  return *this;
}